

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O1

void matchit::impl::IdUtil<std::shared_ptr<mathiu::impl::Expr_const>>::
     bindValue<std::shared_ptr<mathiu::impl::Expr_const>const&>
               (undefined8 v,
               _Variadic_union<std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
               value)

{
  undefined1 local_21;
  undefined8 local_20;
  _Variadic_union<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
  local_18;
  byte local_8;
  
  local_8 = 3;
  local_20 = v;
  local_18._M_rest._M_rest = value;
  std::operator=(&local_20,&local_18,&local_21);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>_&>
    ::_S_vtable._M_arr[local_8]._M_data)
            ((anon_class_1_0_00000001 *)&local_20,
             (variant<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
              *)&local_18);
  return;
}

Assistant:

constexpr static auto bindValue(ValueVariant<Type> &v, Value &&value,
                                                    std::true_type /* StorePointer */)
            {
                v = ValueVariant<Type>{&value};
            }